

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O1

void * btreeblk_enlarge_node(void *voidhandle,bid_t old_bid,size_t req_size,bid_t *new_bid)

{
  long lVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bid_t *pbVar7;
  void *pvVar8;
  ulong bid;
  ulong unaff_RBP;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint sb_no;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  void *local_50;
  
  if ((char)(old_bid >> 0x30) == '\0') {
    return (void *)0x0;
  }
  uVar10 = (ulong)((uint)(old_bid >> 0x35) & 7);
  lVar1 = uVar10 - 1;
  uVar14 = (ulong)((ushort)(old_bid >> 0x30) & 0x1f);
  bid = old_bid & 0xffffffffffff;
  do {
    uVar15 = uVar10;
    if (*(uint *)((long)voidhandle + 0x58) <= (uint)uVar15) {
      uVar15 = 0;
      break;
    }
    uVar10 = (ulong)((uint)uVar15 + 1);
  } while (*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + uVar15 * 0x18) <= req_size);
  lVar4 = *(long *)((long)voidhandle + 0x60);
  puVar2 = (ulong *)(lVar4 + lVar1 * 0x18);
  if ((ulong)*(ushort *)((long)puVar2 + 0xc) == 0) {
    bVar16 = false;
  }
  else {
    uVar10 = 0;
    lVar13 = 0;
    do {
      lVar13 = (lVar13 + 1) - (ulong)(*(char *)(puVar2[2] + uVar10) == '\0');
      uVar10 = uVar10 + 1;
    } while (*(ushort *)((long)puVar2 + 0xc) != uVar10);
    bVar16 = lVar13 == 1;
  }
  bVar17 = true;
  if ((uVar15 != 0) && (unaff_RBP = (ulong)*(ushort *)(lVar4 + 0xc + uVar15 * 0x18), unaff_RBP != 0)
     ) {
    uVar11 = 0;
    lVar13 = 0;
    uVar10 = unaff_RBP;
    do {
      uVar9 = uVar10;
      if (uVar10 == unaff_RBP) {
        uVar9 = uVar11;
      }
      bVar17 = *(char *)(*(long *)(lVar4 + uVar15 * 0x18 + 0x10) + uVar11) != '\0';
      if (bVar17) {
        uVar9 = uVar10;
      }
      lVar13 = lVar13 + (ulong)bVar17;
      uVar11 = uVar11 + 1;
      uVar10 = uVar9;
    } while (unaff_RBP != uVar11);
    bVar17 = lVar13 == 0;
    unaff_RBP = uVar9;
  }
  sb_no = (uint)uVar15;
  iVar6 = (int)lVar1;
  if (!bVar17) {
    pvVar8 = _btreeblk_read(voidhandle,bid,iVar6);
    iVar6 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),
                                *(bid_t *)(*(long *)((long)voidhandle + 0x60) + uVar15 * 0x18));
    if ((iVar6 == 0) ||
       (unaff_RBP == *(ushort *)(*(long *)((long)voidhandle + 0x60) + 0xc + uVar15 * 0x18))) {
      lVar4 = uVar15 * 0x18;
      local_50 = _btreeblk_alloc(voidhandle,(bid_t *)(*(long *)((long)voidhandle + 0x60) + lVar4),
                                 sb_no);
      unaff_RBP = 0;
      memset(*(void **)(*(long *)((long)voidhandle + 0x60) + 0x10 + lVar4),0,
             (ulong)*(ushort *)(*(long *)((long)voidhandle + 0x60) + 0xc + lVar4));
    }
    else {
      local_50 = _btreeblk_read(voidhandle,
                                *(bid_t *)(*(long *)((long)voidhandle + 0x60) + uVar15 * 0x18),sb_no
                               );
      for (lVar4 = *(long *)((long)voidhandle + 0x28); lVar4 != 0; lVar4 = *(long *)(lVar4 + 8)) {
        if (*(ulong *)(lVar4 + -0x20) ==
            (*(ulong *)(*(long *)((long)voidhandle + 0x60) + uVar15 * 0x18) & 0xffffffffffff) /
            (ulong)*(ushort *)((long)voidhandle + 4)) {
          *(undefined1 *)(lVar4 + -0x10) = 1;
          break;
        }
      }
    }
    lVar1 = lVar1 * 0x18;
    uVar10 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar1);
    memcpy((void *)(*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + uVar15 * 0x18) * unaff_RBP +
                   (long)local_50),(void *)((long)pvVar8 + uVar14 * uVar10),uVar10);
    *(undefined1 *)
     (*(long *)(*(long *)((long)voidhandle + 0x60) + 0x10 + uVar15 * 0x18) + unaff_RBP) = 1;
    lVar4 = *(long *)((long)voidhandle + 0x60) + lVar1;
    uVar10 = *(ulong *)(*(long *)((long)voidhandle + 0x60) + lVar1);
    if (bid == uVar10) {
      *(undefined1 *)(*(long *)(lVar4 + 0x10) + uVar14) = 0;
    }
    else if (uVar10 != 0xffffffffffffffff) {
      uVar10 = (ulong)*(uint *)(lVar4 + 8);
      filemgr_add_stale_block
                (*(filemgr **)((long)voidhandle + 0x38),uVar14 * uVar10 + bid * *voidhandle,uVar10);
    }
    goto LAB_00117c06;
  }
  if (((!bVar16) || (bid != *puVar2)) ||
     (iVar5 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),bid), iVar5 == 0)) {
    pvVar8 = _btreeblk_read(voidhandle,bid,iVar6);
    if (uVar15 == 0) {
      local_50 = _btreeblk_alloc(voidhandle,new_bid,-1);
      uVar10 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar1 * 0x18);
      memcpy(local_50,(void *)((long)pvVar8 + uVar14 * uVar10),uVar10);
    }
    else {
      local_50 = _btreeblk_alloc(voidhandle,
                                 (bid_t *)(*(long *)((long)voidhandle + 0x60) + uVar15 * 0x18),sb_no
                                );
      uVar10 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar1 * 0x18);
      memcpy(local_50,(void *)((long)pvVar8 + uVar14 * uVar10),uVar10);
      **(undefined1 **)(*(long *)((long)voidhandle + 0x60) + 0x10 + uVar15 * 0x18) = 1;
    }
    puVar2 = (ulong *)(*(long *)((long)voidhandle + 0x60) + lVar1 * 0x18);
    if (bid == *puVar2) {
      *(undefined1 *)(puVar2[2] + uVar14) = 0;
    }
    else {
      filemgr_add_stale_block
                (*(filemgr **)((long)voidhandle + 0x38),uVar14 * (uint)puVar2[1] + bid * *voidhandle
                 ,(ulong)(uint)puVar2[1]);
    }
    unaff_RBP = 0;
    goto LAB_00117c06;
  }
  local_50 = _btreeblk_read(voidhandle,bid,iVar6);
  lVar4 = *(long *)((long)voidhandle + 0x60);
  pbVar7 = (bid_t *)(lVar4 + uVar15 * 0x18);
  if (uVar15 == 0) {
    pbVar7 = new_bid;
  }
  *pbVar7 = *(bid_t *)(lVar4 + lVar1 * 0x18);
  uVar10 = (*(ulong *)(lVar4 + lVar1 * 0x18) & 0xffffffffffff) /
           (ulong)*(ushort *)((long)voidhandle + 4);
  lVar13 = *(long *)((long)voidhandle + 0x28);
  for (lVar12 = lVar13; lVar12 != 0; lVar12 = *(long *)(lVar12 + 8)) {
    if (*(ulong *)(lVar12 + -0x20) == uVar10) {
      *(undefined1 *)(lVar12 + -0x10) = 1;
      break;
    }
  }
  for (lVar12 = *(long *)((long)voidhandle + 0x18); lVar12 != 0; lVar12 = *(long *)(lVar12 + 8)) {
    if (*(ulong *)(lVar12 + -0x20) == uVar10) goto LAB_00117ce7;
  }
  for (; lVar13 != 0; lVar13 = *(long *)(lVar13 + 8)) {
    lVar12 = lVar13;
    if (*(ulong *)(lVar13 + -0x20) == uVar10) goto LAB_00117ce7;
  }
LAB_00117ced:
  if (uVar14 != 0) {
    uVar10 = (ulong)*(uint *)(lVar4 + 8 + lVar1 * 0x18);
    memmove(local_50,(void *)((long)local_50 + uVar14 * uVar10),uVar10);
  }
  if (uVar15 != 0) {
    **(undefined1 **)(*(long *)((long)voidhandle + 0x60) + 0x10 + uVar15 * 0x18) = 1;
  }
  if (bid == *(ulong *)(*(long *)((long)voidhandle + 0x60) + lVar1 * 0x18)) {
    puVar3 = (undefined8 *)(*(long *)((long)voidhandle + 0x60) + lVar1 * 0x18);
    *puVar3 = 0xffffffffffffffff;
    unaff_RBP = 0;
    memset((void *)puVar3[2],0,(ulong)*(ushort *)((long)puVar3 + 0xc));
  }
  else {
    unaff_RBP = 0;
  }
LAB_00117c06:
  if (uVar15 != 0) {
    lVar1 = *(long *)((long)voidhandle + 0x60);
    *new_bid = (ulong)(sb_no * 0x20 + 0x20 | (uint)unaff_RBP) << 0x30 |
               *(ulong *)(lVar1 + uVar15 * 0x18);
    local_50 = (void *)((long)local_50 + *(uint *)(lVar1 + 8 + uVar15 * 0x18) * unaff_RBP);
  }
  return local_50;
LAB_00117ce7:
  *(uint *)(lVar12 + -0x18) = -(uint)(uVar15 == 0) | sb_no;
  goto LAB_00117ced;
}

Assistant:

void * btreeblk_enlarge_node(void *voidhandle,
                             bid_t old_bid,
                             size_t req_size,
                             bid_t *new_bid)
{
    uint32_t i;
    bid_t bid;
    size_t src_sb, src_idx, src_nitems;
    size_t dst_sb, dst_idx, dst_nitems;
    void *src_addr, *dst_addr;
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    if (!is_subblock(old_bid)) {
        return NULL;
    }
    src_addr = dst_addr = NULL;
    subbid2bid(old_bid, &src_sb, &src_idx, &bid);

    dst_sb = 0;
    // find sublock that can accommodate req_size
    for (i=src_sb+1; i<handle->nsb; ++i){
        if (handle->sb[i].sb_size > req_size) {
            dst_sb = i;
            break;
        }
    }

    src_nitems = 0;
    for (i=0;i<handle->sb[src_sb].nblocks;++i){
        if (handle->sb[src_sb].bitmap[i]) {
            src_nitems++;
        }
    }

    dst_nitems = 0;
    if (dst_sb > 0) {
        dst_idx = handle->sb[dst_sb].nblocks;
        for (i=0;i<handle->sb[dst_sb].nblocks;++i){
            if (handle->sb[dst_sb].bitmap[i]) {
                dst_nitems++;
            } else if (dst_idx == handle->sb[dst_sb].nblocks) {
                dst_idx = i;
            }
        }
    }

    if (dst_nitems == 0) {
        // destination block is empty
        dst_idx = 0;
        if (src_nitems == 1 &&
            bid == handle->sb[src_sb].bid &&
            filemgr_is_writable(handle->file, bid)) {
            //2 case 1
            // if there's only one subblock in the source block, and
            // the source block is still writable and allocable,
            // then switch source block to destination block
            src_addr = _btreeblk_read(voidhandle, bid, src_sb);
            dst_addr = src_addr;
            if (dst_sb > 0) {
                handle->sb[dst_sb].bid = handle->sb[src_sb].bid;
            } else {
                *new_bid = handle->sb[src_sb].bid;
            }
            btreeblk_set_dirty(voidhandle, handle->sb[src_sb].bid);
            // we MUST change block->sb_no value since subblock is switched.
            // dst_sb == 0: regular block, otherwise: sub-block
            _btreeblk_set_sb_no(voidhandle, handle->sb[src_sb].bid,
                                ((dst_sb)?(dst_sb):(-1)));

            if (src_idx > 0 || dst_addr != src_addr) {
                // move node to the beginning of the block
                memmove(dst_addr,
                        (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                        handle->sb[src_sb].sb_size);
            }
            if (dst_sb > 0) {
                handle->sb[dst_sb].bitmap[dst_idx] = 1;
            }
            if (bid == handle->sb[src_sb].bid) {
                // remove existing source block info
                handle->sb[src_sb].bid = BLK_NOT_FOUND;
                memset(handle->sb[src_sb].bitmap, 0,
                       handle->sb[src_sb].nblocks);
            }

        } else {
            //2 case 2
            // if there are more than one subblock in the source block,
            // or no more subblock is allocable from the current source block,
            // then allocate a new destination block and move the target subblock only.
            src_addr = _btreeblk_read(voidhandle, bid, src_sb);

            if (dst_sb > 0) {
                // case 2-1: enlarged block will be also a subblock
                dst_addr = _btreeblk_alloc(voidhandle, &handle->sb[dst_sb].bid, dst_sb);
                memcpy((uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx,
                       (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                       handle->sb[src_sb].sb_size);
                handle->sb[dst_sb].bitmap[dst_idx] = 1;
            } else {
                // case 2-2: enlarged block will be a regular block
                dst_addr = btreeblk_alloc(voidhandle, new_bid);
                memcpy((uint8_t*)dst_addr,
                       (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                       handle->sb[src_sb].sb_size);
            }

            // Mark the source subblock as stale.
            if (bid == handle->sb[src_sb].bid) {
                // The current source block may be still allocable.
                // Remove the corresponding bitmap from the source bitmap.
                // All unused subblocks will be marked as stale when this block
                // becomes immutable.
                handle->sb[src_sb].bitmap[src_idx] = 0;

                // TODO: what if FDB handle is closed without fdb_commit() ?
            } else if (bid != BLK_NOT_FOUND) {
                // The current source block will not be used for allocation anymore.
                // Mark the corresponding subblock as stale.
                _btreeblk_add_stale_block(handle,
                    (bid * handle->nodesize) + (src_idx * handle->sb[src_sb].sb_size),
                    handle->sb[src_sb].sb_size);
            }
        }
    } else {
        //2 case 3
        // destination block exists
        // (happens only when the destination block is
        //  a parent block of subblock set)
        src_addr = _btreeblk_read(voidhandle, bid, src_sb);
        if (filemgr_is_writable(handle->file, handle->sb[dst_sb].bid) &&
            dst_idx != handle->sb[dst_sb].nblocks) {
            // case 3-1
            dst_addr = _btreeblk_read(voidhandle, handle->sb[dst_sb].bid, dst_sb);
            btreeblk_set_dirty(voidhandle, handle->sb[dst_sb].bid);
        } else {
            // case 3-2: allocate new destination block
            dst_addr = _btreeblk_alloc(voidhandle, &handle->sb[dst_sb].bid, dst_sb);
            memset(handle->sb[dst_sb].bitmap, 0, handle->sb[dst_sb].nblocks);
            dst_idx = 0;
        }

        memcpy((uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx,
               (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
               handle->sb[src_sb].sb_size);
        handle->sb[dst_sb].bitmap[dst_idx] = 1;

        // Mark the source subblock as stale.
        if (bid == handle->sb[src_sb].bid) {
            // The current source block may be still allocable.
            // Remove the corresponding bitmap from the source bitmap.
            // All unused subblocks will be marked as stale when this block
            // becomes immutable.
            handle->sb[src_sb].bitmap[src_idx] = 0;
        } else if (handle->sb[src_sb].bid != BLK_NOT_FOUND) {
            // The current source block will not be used for allocation anymore.
            // Mark the corresponding subblock as stale.
            _btreeblk_add_stale_block(handle,
                (bid * handle->nodesize) + (src_idx * handle->sb[src_sb].sb_size),
                handle->sb[src_sb].sb_size);
        }

    }

    if (dst_sb > 0) {
        // sub block
        bid2subbid(handle->sb[dst_sb].bid, dst_sb, dst_idx, new_bid);
        return (uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx;
    } else {
        // whole block
        return dst_addr;
    }
}